

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  undefined1 uVar2;
  Type TVar3;
  Type TVar4;
  int iVar5;
  Message *pMVar6;
  pointer pMVar7;
  string *__rhs;
  string *in_RDX;
  FieldDescriptor *in_RSI;
  undefined8 *in_RDI;
  UnknownFieldSet *group;
  string serial;
  Parser parser;
  AggregateOptionFinder finder;
  AggregateErrorCollector collector;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> dynamic;
  Descriptor *type;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  OptionInterpreter *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  LogLevel_conflict level;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  FieldDescriptor *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  undefined8 in_stack_fffffffffffffcf8;
  int number;
  undefined4 in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  LogMessage *in_stack_fffffffffffffd28;
  LogMessage *in_stack_fffffffffffffd30;
  LogMessage *in_stack_fffffffffffffd38;
  string local_250 [36];
  undefined4 local_22c;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  Parser local_1c8;
  Finder local_1a0;
  undefined8 local_198;
  ErrorCollector local_190 [5];
  byte local_161;
  string local_160 [39];
  byte local_139;
  Descriptor *local_f8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  FieldDescriptor *local_18;
  byte local_1;
  
  number = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = UninterpretedOption::has_aggregate_value((UninterpretedOption *)0x4b4e38);
  if (bVar1) {
    local_f8 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffcd0);
    pMVar6 = DynamicMessageFactory::GetPrototype
                       ((DynamicMessageFactory *)
                        CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                        (Descriptor *)in_stack_fffffffffffffce8);
    (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])();
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                *)in_stack_fffffffffffffcd0,
               (pointer)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    pMVar7 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::get((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                    *)in_stack_fffffffffffffcd0);
    local_139 = 0;
    local_161 = 0;
    if (pMVar7 == (pointer)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      local_139 = 1;
      in_stack_fffffffffffffd38 =
           internal::LogMessage::operator<<
                     ((LogMessage *)in_stack_fffffffffffffcd0,
                      (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      in_stack_fffffffffffffd30 =
           internal::LogMessage::operator<<
                     ((LogMessage *)in_stack_fffffffffffffcd0,
                      (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      FieldDescriptor::DebugString_abi_cxx11_(in_stack_fffffffffffffce8);
      local_161 = 1;
      in_stack_fffffffffffffd28 =
           internal::LogMessage::operator<<
                     ((LogMessage *)in_stack_fffffffffffffcd0,
                      (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffcd0,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    }
    if ((local_161 & 1) != 0) {
      std::__cxx11::string::~string(local_160);
    }
    if ((local_139 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)0x4b51d2);
    }
    anon_unknown_1::AggregateErrorCollector::AggregateErrorCollector
              ((AggregateErrorCollector *)in_stack_fffffffffffffcd0);
    AggregateOptionFinder::AggregateOptionFinder((AggregateOptionFinder *)in_stack_fffffffffffffcd0)
    ;
    local_198 = *in_RDI;
    TextFormat::Parser::Parser((Parser *)in_stack_fffffffffffffcd0);
    TextFormat::Parser::RecordErrorsTo(&local_1c8,local_190);
    TextFormat::Parser::SetFinder(&local_1c8,&local_1a0);
    UninterpretedOption::aggregate_value_abi_cxx11_((UninterpretedOption *)0x4b524f);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::get
              ((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                *)in_stack_fffffffffffffcd0);
    uVar2 = TextFormat::Parser::ParseFromString
                      ((Parser *)in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30,
                       (Message *)in_stack_fffffffffffffd28);
    if ((bool)uVar2) {
      std::__cxx11::string::string(local_250);
      level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
      operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  *)0x4b5487);
      MessageLite::SerializeToString
                ((MessageLite *)in_stack_fffffffffffffcd0,
                 (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      TVar3 = FieldDescriptor::type
                        ((FieldDescriptor *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      if (TVar3 == TYPE_MESSAGE) {
        FieldDescriptor::number(local_18);
        UnknownFieldSet::AddLengthDelimited
                  ((UnknownFieldSet *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,
                   (string *)0x4b54e8);
      }
      else {
        TVar4 = FieldDescriptor::type
                          ((FieldDescriptor *)
                           CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        if (TVar4 != TYPE_GROUP) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     level,(char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
          internal::LogMessage::operator<<
                    ((LogMessage *)in_stack_fffffffffffffcd0,
                     (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffcd0,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          internal::LogMessage::~LogMessage((LogMessage *)0x4b55a0);
        }
        iVar5 = FieldDescriptor::number(local_18);
        in_stack_fffffffffffffcd0 =
             (OptionInterpreter *)
             UnknownFieldSet::AddGroup
                       ((UnknownFieldSet *)CONCAT44(TVar3,in_stack_fffffffffffffd00),number);
        UnknownFieldSet::ParseFromString
                  ((UnknownFieldSet *)CONCAT44(iVar5,in_stack_fffffffffffffce0),local_20);
      }
      local_1 = 1;
      local_22c = 1;
      std::__cxx11::string::~string(local_250);
    }
    else {
      __rhs = FieldDescriptor::name_abi_cxx11_(local_18);
      std::operator+((char *)CONCAT17(uVar2,in_stack_fffffffffffffd18),__rhs);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffcd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcd0);
      AddValueError(in_stack_fffffffffffffcd0,
                    (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      local_1 = 0;
      local_22c = 1;
    }
    TextFormat::Parser::~Parser(&local_1c8);
    AggregateOptionFinder::~AggregateOptionFinder((AggregateOptionFinder *)0x4b5675);
    anon_unknown_1::AggregateErrorCollector::~AggregateErrorCollector
              ((AggregateErrorCollector *)in_stack_fffffffffffffcd0);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 *)in_stack_fffffffffffffcd0);
  }
  else {
    FieldDescriptor::full_name_abi_cxx11_(local_18);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                   in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
    FieldDescriptor::name_abi_cxx11_(local_18);
    std::operator+(in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcd0);
    std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
    FieldDescriptor::name_abi_cxx11_(local_18);
    std::operator+(in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcd0);
    std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
    local_1 = AddValueError(in_stack_fffffffffffffcd0,
                            (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
    ;
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" +
                         option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" +
                         option_field->name() + ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}